

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode curl_multi_perform(Curl_multi *multi,int *running_handles)

{
  int *piVar1;
  CURLMcode CVar2;
  CURLMcode CVar3;
  Curl_tree *pCVar4;
  Curl_easy *data;
  curltime cVar5;
  curltime now_00;
  curltime now;
  Curl_tree *t;
  curltime local_e8;
  int *local_d8;
  anon_union_8_2_5ad2d23e_for___sigaction_handler local_d0 [19];
  char local_38;
  
  cVar5 = Curl_now();
  local_e8.tv_sec = cVar5.tv_sec;
  local_e8.tv_usec = cVar5.tv_usec;
  CVar3 = CURLM_BAD_HANDLE;
  if (((multi != (Curl_multi *)0x0) && (multi->magic == 0xbab1e)) &&
     (CVar3 = CURLM_RECURSIVE_API_CALL, multi->in_callback == false)) {
    data = multi->easyp;
    CVar3 = CURLM_OK;
    local_d8 = running_handles;
    if (data != (Curl_easy *)0x0) {
      do {
        sigpipe_ignore(data,(sigpipe_ignore *)local_d0);
        CVar2 = multi_runsingle(multi,&local_e8,data);
        if (local_38 == '\0') {
          sigaction(0xd,(sigaction *)local_d0,(sigaction *)0x0);
        }
        if (CVar2 != CURLM_OK) {
          CVar3 = CVar2;
        }
        data = data->next;
      } while (data != (Curl_easy *)0x0);
    }
    piVar1 = local_d8;
    do {
      cVar5.tv_usec = local_e8.tv_usec;
      cVar5.tv_sec = local_e8.tv_sec;
      cVar5._12_4_ = 0;
      pCVar4 = Curl_splaygetbest(cVar5,multi->timetree,(Curl_tree **)&local_d0[0].sa_handler);
      multi->timetree = pCVar4;
      if (local_d0[0].sa_handler != (__sighandler_t)0x0) {
        now_00.tv_usec = local_e8.tv_usec;
        now_00.tv_sec = local_e8.tv_sec;
        now_00._12_4_ = 0;
        add_next_timeout(now_00,multi,*(Curl_easy **)(local_d0[0].sa_handler + 0x30));
      }
    } while (local_d0[0].sa_handler != (__sighandler_t)0x0);
    *piVar1 = multi->num_alive;
    if (CVar3 < CURLM_BAD_HANDLE) {
      CVar3 = Curl_update_timer(multi);
    }
  }
  return CVar3;
}

Assistant:

CURLMcode curl_multi_perform(struct Curl_multi *multi, int *running_handles)
{
  struct Curl_easy *data;
  CURLMcode returncode = CURLM_OK;
  struct Curl_tree *t;
  struct curltime now = Curl_now();

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  data = multi->easyp;
  while(data) {
    CURLMcode result;
    SIGPIPE_VARIABLE(pipe_st);

    sigpipe_ignore(data, &pipe_st);
    result = multi_runsingle(multi, &now, data);
    sigpipe_restore(&pipe_st);

    if(result)
      returncode = result;

    data = data->next; /* operate on next handle */
  }

  /*
   * Simply remove all expired timers from the splay since handles are dealt
   * with unconditionally by this function and curl_multi_timeout() requires
   * that already passed/handled expire times are removed from the splay.
   *
   * It is important that the 'now' value is set at the entry of this function
   * and not for the current time as it may have ticked a little while since
   * then and then we risk this loop to remove timers that actually have not
   * been handled!
   */
  do {
    multi->timetree = Curl_splaygetbest(now, multi->timetree, &t);
    if(t)
      /* the removed may have another timeout in queue */
      (void)add_next_timeout(now, multi, t->payload);

  } while(t);

  *running_handles = multi->num_alive;

  if(CURLM_OK >= returncode)
    returncode = Curl_update_timer(multi);

  return returncode;
}